

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

MM<45UL> __thiscall
GF2::MI<45UL,_GF2::MOGrlex<45UL>_>::GatherVars(MI<45UL,_GF2::MOGrlex<45UL>_> *this)

{
  ulong uVar1;
  _List_node_base *p_Var2;
  MM<45UL> *vars;
  WW<45UL> in_RDI;
  _List_node_base **pp_Var3;
  
  uVar1 = 0;
  p_Var2 = (_List_node_base *)this;
  while (p_Var2 = (((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                     *)&p_Var2->_M_next)->
                  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this
        ) {
    pp_Var3 = &p_Var2[1]._M_next;
    while (pp_Var3 = &(*pp_Var3)->_M_next, (_List_node_base *)pp_Var3 != p_Var2 + 1) {
      uVar1 = uVar1 | ((long *)pp_Var3)[2];
    }
  }
  *(ulong *)in_RDI._words[0] = uVar1;
  return (WW<45UL>)(WW<45UL>)in_RDI._words[0];
}

Assistant:

MM<_n> GatherVars() const
	{	
		MM<_n> vars;
		for (const_iterator iter = begin(); iter != end(); ++iter)
		{
			auto iterPoly = iter->begin();
			for (; iterPoly != iter->end(); ++iterPoly)
				vars *= *iterPoly;
		}
		return vars;
	}